

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O0

void TPZShapeHDivConstant<pzshape::TPZShapeTetra>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  int iVar1;
  double *pdVar2;
  int *piVar3;
  TPZFMatrix<double> *this;
  long *in_RCX;
  long in_RSI;
  double dVar4;
  int d_2;
  int i_1;
  int d_1;
  int k;
  int d;
  int i;
  int countKernel;
  int count;
  TPZFMatrix<double> curlPhiAux;
  TPZFMatrix<double> phiAux;
  int nshape_1;
  int nshapehcurl;
  int nEdges;
  int nshape;
  TPZVec<double> div;
  TPZFNMatrix<12,_double> vecDiv;
  int nfacets;
  int dim;
  int nsides;
  int ncorner;
  int64_t in_stack_fffffffffffffc88;
  TPZShapeData *in_stack_fffffffffffffc90;
  double *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  TPZFNMatrix<12,_double> *in_stack_fffffffffffffcb0;
  int64_t in_stack_fffffffffffffcc0;
  int64_t in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  int iVar5;
  double *in_stack_fffffffffffffcd8;
  TPZVec<double> *in_stack_fffffffffffffce0;
  TPZVec<double> *in_stack_fffffffffffffd20;
  TPZFMatrix<double> *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  TPZVec<double> local_148 [4];
  TPZFMatrix<double> *in_stack_ffffffffffffff48;
  TPZFMatrix<double> *in_stack_ffffffffffffff50;
  TPZShapeData *in_stack_ffffffffffffff58;
  TPZVec<double> *in_stack_ffffffffffffff60;
  
  TPZFNMatrix<12,_double>::TPZFNMatrix
            (in_stack_fffffffffffffcb0,CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
             ,(int64_t)in_stack_fffffffffffffca0);
  TPZVec<double>::TPZVec((TPZVec<double> *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  TPZFMatrix<double>::Zero((TPZFMatrix<double> *)in_stack_fffffffffffffc90);
  TPZVec<double>::Fill
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
             CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),in_stack_fffffffffffffcc8
            );
  pztopology::TPZTetrahedron::ComputeConstantHDiv
            ((TPZVec<double> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RSI + 0x22a0));
  (**(code **)(*in_RCX + 0x78))();
  iVar1 = pztopology::TPZTetrahedron::NumSides(0x18b8aaf);
  TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::NHCurlShapeF((TPZShapeData *)0x18b8ad3);
  NHDivShapeF(in_stack_fffffffffffffc90);
  TPZFMatrix<double>::TPZFMatrix
            ((TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  TPZFMatrix<double>::TPZFMatrix
            ((TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  TPZFMatrix<double>::Zero((TPZFMatrix<double> *)in_stack_fffffffffffffc90);
  TPZFMatrix<double>::Zero((TPZFMatrix<double> *)in_stack_fffffffffffffc90);
  TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::Shape
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  for (local_29c = 0; local_29c < 4; local_29c = local_29c + 1) {
    for (local_2a0 = 0; local_2a0 < 3; local_2a0 = local_2a0 + 1) {
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffcb0->super_TPZFMatrix<double>,
                          CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                          (int64_t)in_stack_fffffffffffffca0);
      dVar4 = *pdVar2;
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RSI + 0x2c70),(long)local_29c);
      iVar5 = *piVar3;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffcb0->super_TPZFMatrix<double>,
                          CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                          (int64_t)in_stack_fffffffffffffca0);
      *pdVar2 = dVar4 * (double)iVar5;
    }
    pdVar2 = TPZVec<double>::operator[](local_148,(long)local_29c);
    dVar4 = *pdVar2;
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RSI + 0x2c70),(long)local_29c);
    dVar4 = dVar4 * (double)*piVar3;
    pdVar2 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffffcb0->super_TPZFMatrix<double>,
                        CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                        (int64_t)in_stack_fffffffffffffca0);
    *pdVar2 = dVar4;
    local_2a4 = 0;
    while( true ) {
      iVar5 = local_2a4;
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RSI + 0x2be0),(long)iVar1);
      if (*piVar3 <= iVar5) break;
      for (local_2a8 = 0; local_2a8 < 3; local_2a8 = local_2a8 + 1) {
        pdVar2 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffffcb0->super_TPZFMatrix<double>,
                            CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                            (int64_t)in_stack_fffffffffffffca0);
        dVar4 = *pdVar2;
        pdVar2 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffffcb0->super_TPZFMatrix<double>,
                            CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                            (int64_t)in_stack_fffffffffffffca0);
        *pdVar2 = dVar4;
      }
      local_2a4 = local_2a4 + 1;
    }
  }
  local_2ac = 0;
  while( true ) {
    iVar1 = local_2ac;
    this = (TPZFMatrix<double> *)TPZVec<int>::operator[]((TPZVec<int> *)(in_RSI + 0x2be0),10);
    if (*(int *)&(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                 _vptr_TPZSavable <= iVar1) break;
    for (local_2b0 = 0; local_2b0 < 3; local_2b0 = local_2b0 + 1) {
      in_stack_fffffffffffffca0 =
           TPZFMatrix<double>::operator()
                     (this,CONCAT44(iVar1,in_stack_fffffffffffffca8),
                      (int64_t)in_stack_fffffffffffffca0);
      in_stack_fffffffffffffc90 = (TPZShapeData *)*in_stack_fffffffffffffca0;
      pdVar2 = TPZFMatrix<double>::operator()
                         (this,CONCAT44(iVar1,in_stack_fffffffffffffca8),
                          (int64_t)in_stack_fffffffffffffca0);
      *pdVar2 = (double)in_stack_fffffffffffffc90;
    }
    local_2ac = local_2ac + 1;
  }
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18b900c);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18b9019);
  TPZVec<double>::~TPZVec((TPZVec<double> *)in_stack_fffffffffffffc90);
  TPZFNMatrix<12,_double>::~TPZFNMatrix((TPZFNMatrix<12,_double> *)0x18b9033);
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    const int nfacets = TSHAPE::NFacets;

    // Compute constant Hdiv functions
    TPZFNMatrix<12,REAL> vecDiv(dim,nfacets);
    TPZVec<REAL> div(nfacets);
    vecDiv.Zero();
    div.Fill(0.);
    // std::cout << "FSide trans ID = " << data.fSideTransformationId << std::endl;
    TSHAPE::ComputeConstantHDiv(pt, vecDiv, div);

    int nshape = data.fPhi.Rows();
    
    if (dim == 2){
        TPZShapeH1<TSHAPE>::Shape(pt,data);    
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);

        int count = 0;
        int countKernel=ncorner;
        //Edge functions
        for (int i = 0; i < nEdges; i++)
        {
            //RT0 Function
            phi(0,count) = vecDiv(0,i) * data.fSideOrient[i];
            phi(1,count) = vecDiv(1,i) * data.fSideOrient[i];
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;

            //Kernel Hdiv
            for (int j = 1; j < data.fHDivConnectOrders[i]; j++)
            {
                phi(0,count) = -data.fDPhi(1,countKernel);
                phi(1,count) =  data.fDPhi(0,countKernel);
                count++;
                countKernel++;
            }
        }
        
        //Internal functions
        for (int i = countKernel; i < nshape; i++){
            phi(0,count) = -data.fDPhi(1,countKernel);
            phi(1,count) =  data.fDPhi(0,countKernel);
            count++;
            countKernel++;
        }
    } else if (dim == 3){
        
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);
        int nshapehcurl = TPZShapeHCurlNoGrads<TSHAPE>::NHCurlShapeF(data);
        int nshape = NHDivShapeF(data);
        
        TPZFMatrix<REAL> phiAux(dim,nshapehcurl),curlPhiAux(3,nshapehcurl);
        phiAux.Zero(); curlPhiAux.Zero();

        TPZShapeHCurlNoGrads<TSHAPE>::Shape(pt,data,phiAux,curlPhiAux);
        
        int count = 0;
        int countKernel=nEdges;

        //Face functions
        for (int i = 0; i < nfacets; i++)
        {
            // std::cout << "Side orient - " << i << " " << data.fSideOrient[i] << std::endl;
            //RT0 Function
            for(auto d = 0; d < dim; d++) {
                phi(d,count) = vecDiv(d,i) * data.fSideOrient[i];
            }
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;
        
            //Kernel HDiv functions
            for (int k = 0; k < data.fHDivNumConnectShape[nEdges]; k++){
                for(auto d = 0; d < dim; d++) {
                    phi(d,count) = curlPhiAux(d,countKernel);               
                }
                countKernel++;
                count++;
            }
        }
        //Internal Functions - HDivKernel
        for (int i = 0; i < data.fHDivNumConnectShape[TSHAPE::NSides-TSHAPE::NCornerNodes-1]; i++)
        {
            for (auto d = 0; d < dim; d++)
            {
                phi(d,count) = curlPhiAux(d,countKernel);  
            }
            countKernel++;
            count++;
        }
        // std::cout << "VecDiv = " << vecDiv << std::endl;
        // std::cout << "divphi = " << divphi << std::endl;
        // std::cout << "phi = " << phi << std::endl;
    } else {
        DebugStop();
    }
    

}